

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2text_format.cc
# Opt level: O0

S2LatLng s2textformat::MakeLatLngOrDie(string_view str)

{
  bool bVar1;
  ostream *poVar2;
  absl *this;
  S2LatLng *in_RCX;
  size_type sVar3;
  string_view str_00;
  string_view piece;
  S2LogMessage local_50;
  S2LogMessageVoidify local_39;
  s2textformat *local_38;
  char *local_30;
  s2textformat *psStack_28;
  string_view str_local;
  S2LatLng latlng;
  
  str_local.ptr_ = (char *)str.length_;
  psStack_28 = (s2textformat *)str.ptr_;
  S2LatLng::S2LatLng((S2LatLng *)&str_local.length_);
  local_38 = psStack_28;
  local_30 = str_local.ptr_;
  str_00.length_ = (size_type)&str_local.length_;
  str_00.ptr_ = str_local.ptr_;
  bVar1 = MakeLatLng(psStack_28,str_00,in_RCX);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    return (R2Point)(R2Point)stack0xffffffffffffffe8;
  }
  sVar3 = 3;
  S2FatalLogMessage::S2FatalLogMessage
            ((S2FatalLogMessage *)&local_50,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2text_format.cc"
             ,0x74,kFatal,(ostream *)&std::cerr);
  poVar2 = S2LogMessage::stream(&local_50);
  poVar2 = std::operator<<(poVar2,"Check failed: MakeLatLng(str, &latlng) ");
  this = (absl *)std::operator<<(poVar2,": str == \"");
  piece.length_ = sVar3;
  piece.ptr_ = str_local.ptr_;
  poVar2 = absl::operator<<(this,(ostream *)psStack_28,piece);
  poVar2 = std::operator<<(poVar2,"\"");
  S2LogMessageVoidify::operator&(&local_39,poVar2);
  S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_50);
}

Assistant:

S2LatLng MakeLatLngOrDie(string_view str) {
  S2LatLng latlng;
  S2_CHECK(MakeLatLng(str, &latlng)) << ": str == \"" << str << "\"";
  return latlng;
}